

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMReader.cc
# Opt level: O1

bool __thiscall OpenMesh::IO::_OMReader_::can_u_read(_OMReader_ *this,istream *_is)

{
  byte bVar1;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
  __tmp;
  pointer pcVar2;
  undefined1 auStack_48 [8];
  vector<char,_std::allocator<char>_> evt;
  
  auStack_48 = (undefined1  [8])0x0;
  evt.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  evt.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  std::vector<char,_std::allocator<char>_>::reserve
            ((vector<char,_std::allocator<char>_> *)auStack_48,0x14);
  pcVar2 = evt.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if ((ulong)((long)evt.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start - (long)auStack_48) < 4) {
    do {
      evt.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._7_1_ = std::istream::get();
      if (evt.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          evt.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                  ((vector<char,_std::allocator<char>_> *)auStack_48,
                   (iterator)
                   evt.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (char *)((long)&evt.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + 7));
      }
      else {
        *evt.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start = evt.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._7_1_;
        evt.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
             = evt.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start + 1;
      }
      pcVar2 = evt.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start;
    } while ((ulong)((long)evt.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start - (long)auStack_48) < 4);
  }
  for (; (undefined1  [8])pcVar2 != auStack_48; pcVar2 = pcVar2 + -1) {
    std::istream::putback((char)_is);
  }
  if (((*(char *)auStack_48 == 'O') && (*(char *)((long)auStack_48 + 1) == 'M')) &&
     ((byte)(*(char *)((long)auStack_48 + 2) + 0xb0U) < 5)) {
    bVar1 = 0x13 >> (*(char *)((long)auStack_48 + 2) + 0xb0U & 0x1f);
  }
  else {
    bVar1 = 0;
  }
  operator_delete((void *)auStack_48);
  return (bool)(bVar1 & 1);
}

Assistant:

bool _OMReader_::can_u_read(std::istream& _is) const
{
  std::vector<char> evt;
  evt.reserve(20);

  // read first 4 characters into a buffer
  while (evt.size() < 4)
    evt.push_back(static_cast<char>(_is.get()));

  // put back all read characters
  std::vector<char>::reverse_iterator it = evt.rbegin();
  while (it != evt.rend())
    _is.putback(*it++);

  // evaluate header information
  OMFormat::Header *hdr = (OMFormat::Header*) &evt[0];

  // first two characters must be 'OM'
  if (hdr->magic_[0] != 'O' || hdr->magic_[1] != 'M')
    return false;

  // 3rd characters defines the mesh type:
  switch (hdr->mesh_) {
    case 'T': // Triangle Mesh
    case 'Q': // Quad Mesh
    case 'P': // Polygonal Mesh
      break;
    default:  // ?
      return false;
  }

  // 4th characters encodes the version
  return supports(hdr->version_);
}